

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticmodel.cpp
# Opt level: O1

int __thiscall ArithmeticModel::init(ArithmeticModel *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  U32 *pUVar4;
  ulong uVar5;
  U32 UVar6;
  
  if (this->distribution == (U32 *)0x0) {
    uVar3 = this->symbols;
    uVar5 = (ulong)uVar3;
    if (uVar3 - 0x801 < 0xfffff801) {
      return -1;
    }
    this->last_symbol = uVar3 - 1;
    if ((uVar3 < 0x11) || (this->compress != false)) {
      this->decoder_table = (U32 *)0x0;
      this->table_size = 0;
      this->table_shift = 0;
      pUVar4 = (U32 *)operator_new__(uVar5 * 8);
      this->distribution = pUVar4;
    }
    else {
      iVar2 = -0xd;
      do {
        cVar1 = (char)iVar2;
        iVar2 = iVar2 + 1;
      } while ((uint)(1 << (cVar1 + 0x12U & 0x1f)) < uVar3);
      UVar6 = 1 << (cVar1 + 0x10U & 0x1f);
      this->table_size = UVar6;
      this->table_shift = -iVar2;
      pUVar4 = (U32 *)operator_new__((ulong)(uVar3 * 2 + UVar6) * 4 + 8);
      this->distribution = pUVar4;
      this->decoder_table = pUVar4 + uVar5 * 2;
    }
    if (this->distribution == (U32 *)0x0) {
      return -1;
    }
    this->symbol_count = this->distribution + uVar5;
  }
  this->total_count = 0;
  UVar6 = this->symbols;
  this->update_cycle = UVar6;
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    if (UVar6 != 0) {
      pUVar4 = this->symbol_count;
      uVar5 = 0;
      do {
        pUVar4[uVar5] = 1;
        uVar5 = uVar5 + 1;
      } while (uVar5 < this->symbols);
    }
  }
  else if (UVar6 != 0) {
    pUVar4 = this->symbol_count;
    uVar5 = 0;
    do {
      pUVar4[uVar5] = *(U32 *)(ctx + uVar5 * 4);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->symbols);
  }
  update(this);
  uVar3 = this->symbols + 6 >> 1;
  this->update_cycle = uVar3;
  this->symbols_until_update = uVar3;
  return 0;
}

Assistant:

I32 ArithmeticModel::init(U32* table)
{
  if (distribution == 0)
  {
    if ( (symbols < 2) || (symbols > (1 << 11)) )
    {
      return -1; // invalid number of symbols
    }
    last_symbol = symbols - 1;
    if ((!compress) && (symbols > 16))
    {
      U32 table_bits = 3;
      while (symbols > (1U << (table_bits + 2))) ++table_bits;
      table_size  = 1 << table_bits;
      table_shift = DM__LengthShift - table_bits;
      distribution = new U32[2*symbols+table_size+2];
      decoder_table = distribution + 2 * symbols;
    }
    else // small alphabet: no table needed
    {                                  
      decoder_table = 0;
      table_size = table_shift = 0;
      distribution = new U32[2*symbols];
    }
    if (distribution == 0)
    {
      return -1; // "cannot allocate model memory");
    }
    symbol_count = distribution + symbols;
  }

  total_count = 0;
  update_cycle = symbols;
  if (table)
    for (U32 k = 0; k < symbols; k++) symbol_count[k] = table[k];
  else
    for (U32 k = 0; k < symbols; k++) symbol_count[k] = 1;

  update();
  symbols_until_update = update_cycle = (symbols + 6) >> 1;

  return 0;
}